

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::ComputeKindedSources(cmGeneratorTarget *this,KindedSources *files,string *config)

{
  pointer *ppSVar1;
  iterator __position;
  pointer pcVar2;
  cmake *this_00;
  cmSourceFile *this_01;
  undefined8 uVar3;
  cmGeneratorTarget *pcVar4;
  bool bVar5;
  int iVar6;
  string *psVar7;
  cmCustomCommand *pcVar8;
  long *plVar9;
  ostream *poVar10;
  cmSourceFileLocation *pcVar11;
  cmListFileBacktrace *r;
  size_type *psVar12;
  uint uVar13;
  cmSourceFile **ppcVar14;
  pointer sourceName;
  pair<std::_Rb_tree_iterator<cmSourceFile_*>,_bool> pVar15;
  cmSourceFile *sf;
  SourceAndKind entry;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> badObjLib;
  string hFileName;
  string cppFileName;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  set<cmSourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_> emitted;
  string ext;
  RegularExpression header_regex;
  cmSourceFile *local_370;
  undefined1 local_368 [32];
  cmSourceFile **local_348;
  iterator iStack_340;
  cmSourceFile **local_338;
  cmGeneratorTarget *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2c8;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2c0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_2b8;
  KindedSources *local_2b0;
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  local_2a8;
  undefined1 local_278 [112];
  ios_base local_208 [264];
  RegularExpression local_100;
  
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_2e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetSourceFiles(this,&local_2e8,config);
  local_100.program = (char *)0x0;
  cmsys::RegularExpression::compile(&local_100,"\\.(h|hh|h\\+\\+|hm|hpp|hxx|in|txx|inl)$");
  local_348 = (cmSourceFile **)0x0;
  iStack_340._M_current = (cmSourceFile **)0x0;
  local_338 = (cmSourceFile **)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2a8._M_impl.super__Rb_tree_header._M_header;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2a8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_2a8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2a8._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_2c0 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&files->ExpectedXamlHeaders;
    local_2c8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&files->ExpectedXamlSources;
    local_2b8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                 *)&files->ExpectedResxHeaders;
    sourceName = local_2e8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    local_330 = this;
    local_2b0 = files;
    do {
      local_370 = cmMakefile::GetOrCreateSource(local_330->Makefile,sourceName,false);
      pVar15 = std::
               _Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
               ::_M_insert_unique<cmSourceFile*const&>
                         ((_Rb_tree<cmSourceFile*,cmSourceFile*,std::_Identity<cmSourceFile*>,std::less<cmSourceFile*>,std::allocator<cmSourceFile*>>
                           *)&local_2a8,&local_370);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        psVar7 = cmSourceFile::GetExtension_abi_cxx11_(local_370);
        cmsys::SystemTools::LowerCase((string *)local_278,psVar7);
        pcVar8 = cmSourceFile::GetCustomCommand(local_370);
        this_01 = local_370;
        uVar13 = 2;
        if ((pcVar8 == (cmCustomCommand *)0x0) &&
           (uVar13 = 4, local_330->Target->TargetTypeValue != UTILITY)) {
          local_368._0_8_ = local_368 + 0x10;
          local_328._M_dataplus._M_p = (pointer)0x10;
          local_368._0_8_ = std::__cxx11::string::_M_create((ulong *)local_368,(ulong)&local_328);
          local_368._16_7_ = SUB87(local_328._M_dataplus._M_p,0);
          local_368[0x17] = (undefined1)((ulong)local_328._M_dataplus._M_p >> 0x38);
          builtin_strncpy((char *)local_368._0_8_,"HEADER_FILE_ONLY",0x10);
          local_368._8_8_ = local_328._M_dataplus._M_p;
          *(char *)(local_368._0_8_ + (long)local_328._M_dataplus._M_p) = '\0';
          bVar5 = cmSourceFile::GetPropertyAsBool(this_01,(string *)local_368);
          if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
            operator_delete((void *)local_368._0_8_,CONCAT17(local_368[0x17],local_368._16_7_) + 1);
          }
          uVar13 = 5;
          if (!bVar5) {
            local_368._24_7_ = 0x5443454a424f5f;
            local_368._16_7_ = 0x414e5245545845;
            local_368[0x17] = 'L';
            local_368._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xf;
            local_368[0x1f] = '\0';
            local_368._0_8_ = local_368 + 0x10;
            bVar5 = cmSourceFile::GetPropertyAsBool(local_370,(string *)local_368);
            if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
              operator_delete((void *)local_368._0_8_,CONCAT17(local_368[0x17],local_368._16_7_) + 1
                             );
            }
            if (bVar5) {
              uVar13 = 3;
              if (local_330->Target->TargetTypeValue == OBJECT_LIBRARY) {
                if (iStack_340._M_current != local_338) goto LAB_0038ec40;
                std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                _M_realloc_insert<cmSourceFile*const&>
                          ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_348,
                           iStack_340,&local_370);
              }
            }
            else {
              cmSourceFile::GetLanguage_abi_cxx11_((string *)local_368,local_370);
              uVar3 = local_368._8_8_;
              if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
                operator_delete((void *)local_368._0_8_,
                                CONCAT17(local_368[0x17],local_368._16_7_) + 1);
              }
              uVar13 = 9;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)uVar3 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                iVar6 = std::__cxx11::string::compare(local_278);
                if (iVar6 == 0) {
                  uVar13 = 8;
                  if (local_330->Target->TargetTypeValue == OBJECT_LIBRARY) {
                    if (iStack_340._M_current == local_338) {
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_348,
                                 iStack_340,&local_370);
                    }
                    else {
LAB_0038ec40:
                      *iStack_340._M_current = local_370;
                      iStack_340._M_current = iStack_340._M_current + 1;
                    }
                  }
                }
                else {
                  iVar6 = std::__cxx11::string::compare(local_278);
                  if (iVar6 == 0) {
                    uVar13 = 6;
                    if (local_330->Target->TargetTypeValue == OBJECT_LIBRARY) {
                      if (iStack_340._M_current != local_338) goto LAB_0038ec40;
                      std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
                      _M_realloc_insert<cmSourceFile*const&>
                                ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&local_348,
                                 iStack_340,&local_370);
                    }
                  }
                  else {
                    iVar6 = std::__cxx11::string::compare(local_278);
                    if (iVar6 == 0) {
                      psVar7 = cmSourceFile::GetFullPath(local_370,(string *)0x0);
                      local_368._0_8_ = local_368 + 0x10;
                      pcVar2 = (psVar7->_M_dataplus)._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)local_368,pcVar2,pcVar2 + psVar7->_M_string_length);
                      std::__cxx11::string::rfind((char)(string *)local_368,0x2e);
                      std::__cxx11::string::substr((ulong)&local_308,(ulong)local_368);
                      plVar9 = (long *)std::__cxx11::string::append((char *)&local_308);
                      psVar12 = (size_type *)(plVar9 + 2);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)*plVar9 ==
                          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)psVar12) {
                        local_328.field_2._M_allocated_capacity = *psVar12;
                        local_328.field_2._8_8_ = plVar9[3];
                        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
                      }
                      else {
                        local_328.field_2._M_allocated_capacity = *psVar12;
                        local_328._M_dataplus._M_p = (pointer)*plVar9;
                      }
                      local_328._M_string_length = plVar9[1];
                      *plVar9 = (long)psVar12;
                      plVar9[1] = 0;
                      *(undefined1 *)(plVar9 + 2) = 0;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_308._M_dataplus._M_p != &local_308.field_2) {
                        operator_delete(local_308._M_dataplus._M_p,
                                        local_308.field_2._M_allocated_capacity + 1);
                      }
                      std::
                      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      ::_M_insert_unique<std::__cxx11::string_const&>(local_2b8,&local_328);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_328._M_dataplus._M_p != &local_328.field_2) {
                        operator_delete(local_328._M_dataplus._M_p,
                                        local_328.field_2._M_allocated_capacity + 1);
                      }
                      if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
                        operator_delete((void *)local_368._0_8_,
                                        CONCAT17(local_368[0x17],local_368._16_7_) + 1);
                      }
                      uVar13 = 10;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare(local_278);
                      if (iVar6 == 0) {
                        uVar13 = 0;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare(local_278);
                        if (iVar6 == 0) {
                          uVar13 = 7;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare(local_278);
                          if (iVar6 == 0) {
                            uVar13 = 1;
                          }
                          else {
                            iVar6 = std::__cxx11::string::compare(local_278);
                            if (iVar6 == 0) {
                              psVar7 = cmSourceFile::GetFullPath(local_370,(string *)0x0);
                              local_368._0_8_ = local_368 + 0x10;
                              pcVar2 = (psVar7->_M_dataplus)._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_368,pcVar2,
                                         pcVar2 + psVar7->_M_string_length);
                              std::operator+(&local_328,(string *)local_368,".h");
                              std::operator+(&local_308,(string *)local_368,".cpp");
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>(local_2c0,&local_328);
                              std::
                              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              ::_M_insert_unique<std::__cxx11::string_const&>(local_2c8,&local_308);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_308._M_dataplus._M_p != &local_308.field_2) {
                                operator_delete(local_308._M_dataplus._M_p,
                                                local_308.field_2._M_allocated_capacity + 1);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_328._M_dataplus._M_p != &local_328.field_2) {
                                operator_delete(local_328._M_dataplus._M_p,
                                                local_328.field_2._M_allocated_capacity + 1);
                              }
                              if ((undefined1 *)local_368._0_8_ != local_368 + 0x10) {
                                operator_delete((void *)local_368._0_8_,
                                                CONCAT17(local_368[0x17],local_368._16_7_) + 1);
                              }
                              uVar13 = 0xb;
                            }
                            else {
                              psVar7 = cmSourceFile::GetFullPath(local_370,(string *)0x0);
                              bVar5 = cmsys::RegularExpression::find
                                                (&local_100,(psVar7->_M_dataplus)._M_p);
                              uVar13 = bVar5 | 4;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        local_368._0_8_ = local_370;
        local_368._8_4_ = uVar13;
        __position._M_current =
             (local_2b0->Sources).
             super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (local_2b0->Sources).
            super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<cmGeneratorTarget::SourceAndKind,std::allocator<cmGeneratorTarget::SourceAndKind>>
          ::_M_realloc_insert<cmGeneratorTarget::SourceAndKind_const&>
                    ((vector<cmGeneratorTarget::SourceAndKind,std::allocator<cmGeneratorTarget::SourceAndKind>>
                      *)local_2b0,__position,(SourceAndKind *)local_368);
        }
        else {
          (__position._M_current)->Source = local_370;
          *(undefined8 *)&(__position._M_current)->Kind = local_368._8_8_;
          ppSVar1 = &(local_2b0->Sources).
                     super__Vector_base<cmGeneratorTarget::SourceAndKind,_std::allocator<cmGeneratorTarget::SourceAndKind>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *ppSVar1 = *ppSVar1 + 1;
        }
        if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
          operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
        }
      }
      pcVar4 = local_330;
      sourceName = sourceName + 1;
    } while (sourceName !=
             local_2e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    if (local_348 != iStack_340._M_current) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_278);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,"OBJECT library \"",0x10);
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_278,(pcVar4->Target->Name)._M_dataplus._M_p,
                           (pcVar4->Target->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" contains:\n",0xc);
      if (local_348 != iStack_340._M_current) {
        ppcVar14 = local_348;
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"  ",2);
          pcVar11 = cmSourceFile::GetLocation(*ppcVar14);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_278,(pcVar11->Name)._M_dataplus._M_p,
                               (pcVar11->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          ppcVar14 = ppcVar14 + 1;
        } while (ppcVar14 != iStack_340._M_current);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_278,
                 "but may contain only sources that compile, header files, and other files that would not affect linking of a normal library."
                 ,0x7b);
      this_00 = pcVar4->GlobalGenerator->CMakeInstance;
      std::__cxx11::stringbuf::str();
      r = cmTarget::GetBacktrace(pcVar4->Target);
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&local_328,r);
      cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_368,(cmListFileBacktrace *)&local_328)
      ;
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&local_328);
      if ((cmSourceFile *)local_368._0_8_ != (cmSourceFile *)(local_368 + 0x10)) {
        operator_delete((void *)local_368._0_8_,CONCAT17(local_368[0x17],local_368._16_7_) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_278);
      std::ios_base::~ios_base(local_208);
    }
  }
  std::
  _Rb_tree<cmSourceFile_*,_cmSourceFile_*,_std::_Identity<cmSourceFile_*>,_std::less<cmSourceFile_*>,_std::allocator<cmSourceFile_*>_>
  ::~_Rb_tree(&local_2a8);
  if (local_348 != (cmSourceFile **)0x0) {
    operator_delete(local_348,(long)local_338 - (long)local_348);
  }
  if (local_100.program != (char *)0x0) {
    operator_delete__(local_100.program);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e8);
  return;
}

Assistant:

void cmGeneratorTarget::ComputeKindedSources(KindedSources& files,
                                             std::string const& config) const
{
  // Get the source file paths by string.
  std::vector<std::string> srcs;
  this->GetSourceFiles(srcs, config);

  cmsys::RegularExpression header_regex(CM_HEADER_REGEX);
  std::vector<cmSourceFile*> badObjLib;

  std::set<cmSourceFile*> emitted;
  for (std::vector<std::string>::const_iterator i = srcs.begin();
       i != srcs.end(); ++i) {
    // Create each source at most once.
    cmSourceFile* sf = this->Makefile->GetOrCreateSource(*i);
    if (!emitted.insert(sf).second) {
      continue;
    }

    // Compute the kind (classification) of this source file.
    SourceKind kind;
    std::string ext = cmSystemTools::LowerCase(sf->GetExtension());
    if (sf->GetCustomCommand()) {
      kind = SourceKindCustomCommand;
    } else if (this->Target->GetType() == cmStateEnums::UTILITY) {
      kind = SourceKindExtra;
    } else if (sf->GetPropertyAsBool("HEADER_FILE_ONLY")) {
      kind = SourceKindHeader;
    } else if (sf->GetPropertyAsBool("EXTERNAL_OBJECT")) {
      kind = SourceKindExternalObject;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (!sf->GetLanguage().empty()) {
      kind = SourceKindObjectSource;
    } else if (ext == "def") {
      kind = SourceKindModuleDefinition;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "idl") {
      kind = SourceKindIDL;
      if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
        badObjLib.push_back(sf);
      }
    } else if (ext == "resx") {
      kind = SourceKindResx;
      // Build and save the name of the corresponding .h file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string resx = sf->GetFullPath();
      std::string hFileName = resx.substr(0, resx.find_last_of('.')) + ".h";
      files.ExpectedResxHeaders.insert(hFileName);
    } else if (ext == "appxmanifest") {
      kind = SourceKindAppManifest;
    } else if (ext == "manifest") {
      kind = SourceKindManifest;
    } else if (ext == "pfx") {
      kind = SourceKindCertificate;
    } else if (ext == "xaml") {
      kind = SourceKindXaml;
      // Build and save the name of the corresponding .h and .cpp file
      // This relationship will be used later when building the project files.
      // Both names would have been auto generated from Visual Studio
      // where the user supplied the file name and Visual Studio
      // appended the suffix.
      std::string xaml = sf->GetFullPath();
      std::string hFileName = xaml + ".h";
      std::string cppFileName = xaml + ".cpp";
      files.ExpectedXamlHeaders.insert(hFileName);
      files.ExpectedXamlSources.insert(cppFileName);
    } else if (header_regex.find(sf->GetFullPath().c_str())) {
      kind = SourceKindHeader;
    } else {
      kind = SourceKindExtra;
    }

    // Save this classified source file in the result vector.
    SourceAndKind entry = { sf, kind };
    files.Sources.push_back(entry);
  }

  if (!badObjLib.empty()) {
    std::ostringstream e;
    e << "OBJECT library \"" << this->GetName() << "\" contains:\n";
    for (std::vector<cmSourceFile*>::const_iterator i = badObjLib.begin();
         i != badObjLib.end(); ++i) {
      e << "  " << (*i)->GetLocation().GetName() << "\n";
    }
    e << "but may contain only sources that compile, header files, and "
         "other files that would not affect linking of a normal library.";
    this->GlobalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR, e.str(), this->GetBacktrace());
  }
}